

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderRenderCase::computeFragmentReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  Vec4 *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Vec4 *pVVar5;
  int iVar6;
  int iVar7;
  Vec4 color;
  ShaderEvalContext evalCtx;
  RGBA local_264;
  ShaderRenderCase *local_260;
  Vec4 local_258;
  ShaderEvalContext local_240;
  
  iVar2 = result->m_width;
  iVar3 = result->m_height;
  local_260 = this;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var,iVar4) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  if (0 < iVar3) {
    pVVar1 = &local_260->m_clearColor;
    iVar7 = 0;
    do {
      if (0 < iVar2) {
        iVar6 = 0;
        do {
          ShaderEvalContext::reset
                    (&local_240,((float)iVar6 + 0.5) / (float)iVar2,
                     ((float)iVar7 + 0.5) / (float)iVar3);
          (*local_260->m_evaluator->_vptr_ShaderEvaluator[2])(local_260->m_evaluator,&local_240);
          pVVar5 = &local_240.color;
          if (local_240.isDiscarded != false) {
            pVVar5 = pVVar1;
          }
          local_258.m_data._0_8_ = *(undefined8 *)pVVar5->m_data;
          local_258.m_data._8_8_ = *(undefined8 *)(pVVar5->m_data + 2);
          if (iVar4 < 1) {
            local_258.m_data[3] = 1.0;
          }
          tcu::RGBA::RGBA(&local_264,&local_258);
          *(deUint32 *)
           ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar7 + iVar6) * 4) =
               local_264.m_value;
          iVar6 = iVar6 + 1;
        } while (iVar2 != iVar6);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar3);
  }
  return;
}

Assistant:

void ShaderRenderCase::computeFragmentReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		float sx = ((float)x + 0.5f) / (float)width;
		float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}